

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::UnsupportedVariableIsDefined(cmGlobalGenerator *this,string *name,bool supported)

{
  cmake *this_00;
  cmValue cVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1c8;
  string local_1b0;
  ostringstream e;
  
  if (((int)CONCAT71(in_register_00000011,supported) == 0) &&
     (cVar1 = cmMakefile::GetDefinition
                        ((cmMakefile *)
                         (((this->Makefiles).
                           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
                         name), cVar1.Value != (string *)0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"Generator\n  ");
    (*this->_vptr_cmGlobalGenerator[3])(&local_1b0,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
    poVar2 = std::operator<<(poVar2,"\ndoes not support variable\n  ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::operator<<(poVar2,"\nbut it has been specified.");
    std::__cxx11::string::~string((string *)&local_1b0);
    this_00 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_1c8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1c8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1c8);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1b0,(cmListFileBacktrace *)&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1c8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return true;
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::UnsupportedVariableIsDefined(const std::string& name,
                                                     bool supported) const
{
  if (!supported && this->Makefiles.front()->GetDefinition(name)) {
    std::ostringstream e;
    /* clang-format off */
    e <<
      "Generator\n"
      "  " << this->GetName() << "\n"
      "does not support variable\n"
      "  " << name << "\n"
      "but it has been specified."
      ;
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return true;
  }

  return false;
}